

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O3

string * __thiscall
FuzzingParameterSet::get_dist_string_abi_cxx11_
          (string *__return_storage_ptr__,FuzzingParameterSet *this)

{
  string *psVar1;
  ostream *poVar2;
  undefined1 auVar3 [8];
  pointer pdVar4;
  double *d;
  ulong uVar5;
  stringstream local_1e0 [8];
  stringstream ss;
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  double local_58;
  string *local_50;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> probs;
  
  local_50 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1e0);
  std::discrete_distribution<int>::probabilities
            ((vector<double,_std::allocator<double>_> *)local_48,&this->N_sided_probabilities);
  if (local_48 !=
      (undefined1  [8])
      probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_58 = 0.0;
    auVar3 = local_48;
    do {
      local_58 = local_58 + *(double *)auVar3;
      auVar3 = (undefined1  [8])((long)auVar3 + 8);
    } while (auVar3 != (undefined1  [8])
                       probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
    if (local_48 !=
        (undefined1  [8])
        probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar5 = 0;
      auVar3 = local_48;
      pdVar4 = probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if ((*(double *)((long)auVar3 + uVar5 * 8) != 0.0) ||
           (NAN(*(double *)((long)auVar3 + uVar5 * 8)))) {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-sided: ",8);
          poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_48 + uVar5 * 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
          poVar2 = std::ostream::_M_insert<double>(local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_171655 + 3,2);
          auVar3 = local_48;
          pdVar4 = probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)pdVar4 - (long)auVar3 >> 3));
    }
  }
  psVar1 = local_50;
  std::__cxx11::stringbuf::str();
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,
                    (long)probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_48);
  }
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::ios_base::~ios_base(local_160);
  return psVar1;
}

Assistant:

std::string FuzzingParameterSet::get_dist_string() const {
  std::stringstream ss;
  double total = 0;
  std::vector<double> probs = N_sided_probabilities.probabilities();
  for (const auto &d : probs) total += d;
  for (size_t i = 0; i < probs.size(); ++i) {
    if (probs[i]==0) continue;
    ss << i << "-sided: " << probs[i] << "/" << total << ", ";
  }
  return ss.str();
}